

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image_utils.cpp
# Opt level: O2

bool crnlib::image_utils::resample_single_thread
               (image_u8 *src,image_u8 *dst,resample_params *params)

{
  float *init9;
  int iVar1;
  byte bVar2;
  uchar uVar3;
  bool bVar4;
  int iVar5;
  Resampler *pRVar6;
  char **ppcVar7;
  Resampler *pRVar8;
  Sample *pSVar9;
  char **init2;
  color_quad<unsigned_char,_int> *pcVar10;
  uint *puVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  int i_1;
  uint *puVar17;
  vector<float> *pvVar18;
  int i;
  long lVar19;
  float fVar20;
  float *in_stack_ffffffffffffdb08;
  uint src_width;
  char **local_24e8;
  uint dst_width;
  uint src_height;
  float local_24d8;
  Boundary_Op local_24d4;
  uint local_24d0;
  uint dst_height;
  undefined4 local_24c8;
  uint local_24c4;
  uint *local_24c0;
  Contrib_List *local_24b8;
  Contrib_List *local_24b0;
  image_u8 *local_24a8;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_249c;
  Resampler *resamplers [4];
  vector<float> samples [4];
  float srgb_to_linear [256];
  uchar linear_to_srgb [8192];
  
  src_width = src->m_width;
  src_height = src->m_height;
  uVar16 = src_height;
  if (src_height < src_width) {
    uVar16 = src_width;
  }
  if (uVar16 < 0x4001) {
    if (params->m_num_comps - 5 < 0xfffffffc) {
      local_24c8 = 0;
      goto LAB_0011641f;
    }
    dst_width = params->m_dst_width;
    dst_height = params->m_dst_height;
    uVar16 = dst_height;
    if (dst_width < dst_height) {
      uVar16 = dst_width;
    }
    uVar14 = dst_height;
    if (dst_height < dst_width) {
      uVar14 = dst_width;
    }
    if ((uVar16 == 0) || (0x4000 < uVar14)) goto LAB_00116402;
    if (src_height != dst_height || src_width != dst_width) {
      local_24a8 = src;
      image<crnlib::color_quad<unsigned_char,_int>_>::clear(dst);
      local_249c.m_u32 = 0xff000000;
      image<crnlib::color_quad<unsigned_char,_int>_>::resize
                (dst,params->m_dst_width,params->m_dst_height,0xffffffff,
                 (color_quad<unsigned_char,_int> *)&local_249c.field_0);
      local_24e8._0_4_ = params->m_source_gamma;
      bVar2 = params->m_srgb;
      if ((bool)bVar2 == true) {
        for (lVar19 = 0; lVar19 != 0x100; lVar19 = lVar19 + 1) {
          fVar20 = powf((float)(int)lVar19 / 255.0,local_24e8._0_4_);
          srgb_to_linear[lVar19] = fVar20;
        }
        bVar2 = params->m_srgb;
      }
      if ((bVar2 & 1) != 0) {
        local_24e8 = (char **)CONCAT44(local_24e8._4_4_,1.0 / local_24e8._0_4_);
        for (lVar19 = 0; lVar19 != 0x2000; lVar19 = lVar19 + 1) {
          fVar20 = powf((float)(int)lVar19 * 0.00012207031,local_24e8._0_4_);
          iVar5 = (int)(fVar20 * 255.0 + 0.5);
          if (0xfe < iVar5) {
            iVar5 = 0xff;
          }
          uVar3 = (uchar)iVar5;
          if (iVar5 < 1) {
            uVar3 = '\0';
          }
          linear_to_srgb[lVar19] = uVar3;
        }
      }
      samples[3].m_p = (float *)0x0;
      samples[3].m_size = 0;
      samples[3].m_capacity = 0;
      samples[2].m_p = (float *)0x0;
      samples[2].m_size = 0;
      samples[2].m_capacity = 0;
      samples[1].m_p = (float *)0x0;
      samples[1].m_size = 0;
      samples[1].m_capacity = 0;
      samples[0].m_p = (float *)0x0;
      samples[0].m_size = 0;
      samples[0].m_capacity = 0;
      local_24d0 = (params->m_wrapping ^ 1) * 2;
      local_24d4 = BOUNDARY_WRAP;
      local_24d8 = 1.0;
      local_24e8 = &params->m_pFilter;
      local_24b0 = (Contrib_List *)0x0;
      local_24b8 = (Contrib_List *)0x0;
      init9 = &params->m_filter_scale;
      init2 = (char **)&dst_height;
      pRVar6 = crnlib_new<crnlib::Resampler,unsigned_int,unsigned_int,unsigned_int,unsigned_int,crnlib::Resampler::Boundary_Op,float,float,char_const*,crnlib::Resampler::Contrib_List*,crnlib::Resampler::Contrib_List*,float,float>
                         ((crnlib *)&src_width,&src_height,&dst_width,(uint *)init2,&local_24d0,
                          &local_24d4,&local_24d8,(float *)local_24e8,(char **)&local_24b0,
                          &local_24b8,(Contrib_List **)init9,init9,in_stack_ffffffffffffdb08);
      resamplers[0] = pRVar6;
      vector<float>::resize(samples,src_width,false);
      pvVar18 = samples;
      for (puVar17 = (uint *)0x1; pvVar18 = pvVar18 + 1,
          ppcVar7 = (char **)(ulong)params->m_num_comps, puVar17 < ppcVar7;
          puVar17 = (uint *)((long)puVar17 + 1)) {
        local_24d0 = (params->m_wrapping ^ 1) * 2;
        local_24d4 = BOUNDARY_WRAP;
        local_24d8 = 1.0;
        local_24b0 = pRVar6->m_Pclist_x;
        local_24b8 = pRVar6->m_Pclist_y;
        init2 = (char **)&dst_height;
        pRVar8 = crnlib_new<crnlib::Resampler,unsigned_int,unsigned_int,unsigned_int,unsigned_int,crnlib::Resampler::Boundary_Op,float,float,char_const*,crnlib::Resampler::Contrib_List*,crnlib::Resampler::Contrib_List*,float,float>
                           ((crnlib *)&src_width,&src_height,&dst_width,(uint *)init2,&local_24d0,
                            &local_24d4,&local_24d8,(float *)local_24e8,(char **)&local_24b0,
                            &local_24b8,(Contrib_List **)init9,init9,in_stack_ffffffffffffdb08);
        resamplers[(long)puVar17] = pRVar8;
        vector<float>::resize(pvVar18,src_width,false);
      }
      iVar5 = 0;
      uVar16 = 0;
LAB_001166af:
      local_24c8 = (undefined4)CONCAT71((int7)((ulong)init2 >> 8),src_height <= uVar16);
      if (src_height > uVar16) {
        pcVar10 = local_24a8->m_pPixels + local_24a8->m_pitch * uVar16;
        for (uVar12 = 0; uVar12 != src_width; uVar12 = uVar12 + 1) {
          uVar13 = params->m_first_comp;
          bVar4 = params->m_srgb;
          for (lVar19 = 0; (long)ppcVar7 << 4 != lVar19; lVar19 = lVar19 + 0x10) {
            if ((uVar13 == 3) || ((bVar4 & 1U) == 0)) {
              fVar20 = (float)(pcVar10->field_0).c[uVar13] * 0.003921569;
            }
            else {
              fVar20 = srgb_to_linear[(pcVar10->field_0).c[uVar13]];
            }
            *(float *)(*(long *)((long)&samples[0].m_p + lVar19) + uVar12 * 4) = fVar20;
            uVar13 = uVar13 + 1;
          }
          pcVar10 = pcVar10 + 1;
        }
        pvVar18 = samples;
        puVar17 = (uint *)0x0;
        local_24c4 = uVar16;
        do {
          puVar11 = puVar17;
          ppcVar7 = (char **)(ulong)params->m_num_comps;
          iVar1 = iVar5;
          local_24e8 = ppcVar7;
          if (ppcVar7 <= puVar11) goto LAB_001167a4;
          bVar4 = Resampler::put_line(resamplers[(long)puVar11],pvVar18->m_p);
          pvVar18 = pvVar18 + 1;
          puVar17 = (uint *)((long)puVar11 + 1);
        } while (bVar4);
        local_24c0 = puVar11;
        for (puVar17 = (uint *)0x0; ppcVar7 = (char **)(ulong)params->m_num_comps, puVar17 < ppcVar7
            ; puVar17 = (uint *)((long)puVar17 + 1)) {
          crnlib_delete<crnlib::Resampler>(resamplers[(long)puVar17]);
        }
        goto LAB_0011688c;
      }
      for (puVar17 = (uint *)0x0; puVar17 < ppcVar7; puVar17 = (uint *)((long)puVar17 + 1)) {
        crnlib_delete<crnlib::Resampler>(resamplers[(long)puVar17]);
        ppcVar7 = (char **)(ulong)params->m_num_comps;
      }
LAB_001168a4:
      lVar19 = 0x30;
      do {
        vector<float>::~vector((vector<float> *)((long)&samples[0].m_p + lVar19));
        lVar19 = lVar19 + -0x10;
      } while (lVar19 != -0x10);
      goto LAB_0011641f;
    }
    image<crnlib::color_quad<unsigned_char,_int>_>::operator=(dst,src);
  }
  else {
LAB_00116402:
    puts("Image is too large!");
  }
  local_24c8 = 1;
LAB_0011641f:
  return SUB41(local_24c8,0);
LAB_001167a4:
  do {
    local_24c0 = puVar11;
    iVar5 = iVar1;
    for (puVar17 = (uint *)0x0; puVar17 < ppcVar7; puVar17 = (uint *)((long)puVar17 + 1)) {
      uVar13 = params->m_first_comp;
      pSVar9 = Resampler::get_line(resamplers[(long)puVar17]);
      if (pSVar9 == (Sample *)0x0) {
        ppcVar7 = (char **)(ulong)params->m_num_comps;
        break;
      }
      uVar16 = uVar13 + (uint)puVar17;
      bVar4 = params->m_srgb;
      uVar13 = dst->m_pitch;
      pcVar10 = dst->m_pPixels;
      for (uVar12 = 0; uVar12 < dst_width; uVar12 = uVar12 + 1) {
        if ((uVar16 != 3 & bVar4) == 0) {
          uVar14 = (uint)(pSVar9[uVar12] * 255.0 + 0.5);
          if (0xfe < (int)uVar14) {
            uVar14 = 0xff;
          }
          if ((int)uVar14 < 1) {
            uVar14 = 0;
          }
        }
        else {
          uVar14 = (uint)(pSVar9[uVar12] * 8192.0 + 0.5);
          if (0x1ffe < (int)uVar14) {
            uVar14 = 0x1fff;
          }
          uVar15 = (ulong)uVar14;
          if ((int)uVar14 < 1) {
            uVar15 = 0;
          }
          uVar14 = (uint)linear_to_srgb[uVar15];
        }
        pcVar10[uVar13 * iVar5 + uVar12].field_0.c[uVar16] = (uchar)uVar14;
      }
      ppcVar7 = (char **)(ulong)params->m_num_comps;
    }
    iVar1 = iVar5 + 1;
    puVar11 = local_24c0;
  } while ((uint)ppcVar7 <= (uint)puVar17);
LAB_0011688c:
  uVar16 = local_24c4 + 1;
  init2 = local_24e8;
  if (local_24c0 < local_24e8) goto LAB_001168a4;
  goto LAB_001166af;
}

Assistant:

bool resample_single_thread(const image_u8& src, image_u8& dst, const resample_params& params)
        {
            const uint src_width = src.get_width();
            const uint src_height = src.get_height();

            if (math::maximum(src_width, src_height) > CRNLIB_RESAMPLER_MAX_DIMENSION)
            {
                printf("Image is too large!\n");
                return EXIT_FAILURE;
            }

            const int cMaxComponents = 4;
            if (((int)params.m_num_comps < 1) || ((int)params.m_num_comps > (int)cMaxComponents))
            {
                return false;
            }

            const uint dst_width = params.m_dst_width;
            const uint dst_height = params.m_dst_height;

            if ((math::minimum(dst_width, dst_height) < 1) || (math::maximum(dst_width, dst_height) > CRNLIB_RESAMPLER_MAX_DIMENSION))
            {
                printf("Image is too large!\n");
                return EXIT_FAILURE;
            }

            if ((src_width == dst_width) && (src_height == dst_height))
            {
                dst = src;
                return true;
            }

            dst.clear();
            dst.resize(params.m_dst_width, params.m_dst_height);

            // Partial gamma correction looks better on mips. Set to 1.0 to disable gamma correction.
            const float source_gamma = params.m_source_gamma; //1.75f;

            float srgb_to_linear[256];
            if (params.m_srgb)
            {
                for (int i = 0; i < 256; ++i)
                {
                    srgb_to_linear[i] = (float)pow(i * 1.0f / 255.0f, source_gamma);
                }
            }

            const int linear_to_srgb_table_size = 8192;
            unsigned char linear_to_srgb[linear_to_srgb_table_size];

            const float inv_linear_to_srgb_table_size = 1.0f / linear_to_srgb_table_size;
            const float inv_source_gamma = 1.0f / source_gamma;

            if (params.m_srgb)
            {
                for (int i = 0; i < linear_to_srgb_table_size; ++i)
                {
                    int k = (int)(255.0f * pow(i * inv_linear_to_srgb_table_size, inv_source_gamma) + .5f);
                    if (k < 0)
                    {
                        k = 0;
                    }
                    else if (k > 255)
                    {
                        k = 255;
                    }
                    linear_to_srgb[i] = (unsigned char)k;
                }
            }

            Resampler* resamplers[cMaxComponents];
            crnlib::vector<float> samples[cMaxComponents];

            resamplers[0] = crnlib_new<Resampler>(src_width, src_height, dst_width, dst_height,
                params.m_wrapping ? Resampler::BOUNDARY_WRAP : Resampler::BOUNDARY_CLAMP, 0.0f, 1.0f,
                params.m_pFilter, (Resampler::Contrib_List*)nullptr, (Resampler::Contrib_List*)nullptr, params.m_filter_scale, params.m_filter_scale);
            samples[0].resize(src_width);

            for (uint i = 1; i < params.m_num_comps; i++)
            {
                resamplers[i] = crnlib_new<Resampler>(src_width, src_height, dst_width, dst_height,
                    params.m_wrapping ? Resampler::BOUNDARY_WRAP : Resampler::BOUNDARY_CLAMP, 0.0f, 1.0f,
                    params.m_pFilter, resamplers[0]->get_clist_x(), resamplers[0]->get_clist_y(), params.m_filter_scale, params.m_filter_scale);
                samples[i].resize(src_width);
            }

            uint dst_y = 0;

            for (uint src_y = 0; src_y < src_height; src_y++)
            {
                const color_quad_u8* pSrc = src.get_scanline(src_y);

                for (uint x = 0; x < src_width; x++)
                {
                    for (uint c = 0; c < params.m_num_comps; c++)
                    {
                        const uint comp_index = params.m_first_comp + c;
                        const uint8 v = (*pSrc)[comp_index];

                        if (!params.m_srgb || (comp_index == 3))
                        {
                            samples[c][x] = v * (1.0f / 255.0f);
                        }
                        else
                        {
                            samples[c][x] = srgb_to_linear[v];
                        }
                    }

                    pSrc++;
                }

                for (uint c = 0; c < params.m_num_comps; c++)
                {
                    if (!resamplers[c]->put_line(&samples[c][0]))
                    {
                        for (uint i = 0; i < params.m_num_comps; i++)
                        {
                            crnlib_delete(resamplers[i]);
                        }
                        return false;
                    }
                }

                for (;;)
                {
                    uint c;
                    for (c = 0; c < params.m_num_comps; c++)
                    {
                        const uint comp_index = params.m_first_comp + c;

                        const float* pOutput_samples = resamplers[c]->get_line();
                        if (!pOutput_samples)
                        {
                            break;
                        }

                        const bool linear = !params.m_srgb || (comp_index == 3);
                        CRNLIB_ASSERT(dst_y < dst_height);
                        color_quad_u8* pDst = dst.get_scanline(dst_y);

                        for (uint x = 0; x < dst_width; x++)
                        {
                            if (linear)
                            {
                                int c = (int)(255.0f * pOutput_samples[x] + .5f);
                                if (c < 0)
                                {
                                    c = 0;
                                }
                                else if (c > 255)
                                {
                                    c = 255;
                                }
                                (*pDst)[comp_index] = (unsigned char)c;
                            }
                            else
                            {
                                int j = (int)(linear_to_srgb_table_size * pOutput_samples[x] + .5f);
                                if (j < 0)
                                {
                                    j = 0;
                                }
                                else if (j >= linear_to_srgb_table_size)
                                {
                                    j = linear_to_srgb_table_size - 1;
                                }
                                (*pDst)[comp_index] = linear_to_srgb[j];
                            }

                            pDst++;
                        }
                    }
                    if (c < params.m_num_comps)
                    {
                        break;
                    }

                    dst_y++;
                }
            }

            for (uint i = 0; i < params.m_num_comps; i++)
            {
                crnlib_delete(resamplers[i]);
            }

            return true;
        }